

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

void envy_bios_print_power_unk48(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk48.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk48.version;
  if ((bios->power).unk48.valid != '\0') {
    fprintf((FILE *)out,"THERMAL CHANNEL table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk48.offset,(uint)(bios->power).unk48.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    for (uVar2 = 0; uVar2 < (bios->power).unk48.entriesnum; uVar2 = uVar2 + 1) {
      envy_bios_dump_hex(bios,out,(bios->power).unk48.entries[uVar2].offset,
                         (uint)(bios->power).unk48.rlen,mask);
      if ((int)mask < 0) {
        fputc(10,(FILE *)out);
      }
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse THERMAL CHANNEL table at 0x%x, version %x\n",(ulong)uVar1,
          uVar2);
  return;
}

Assistant:

void envy_bios_print_power_unk48(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk48 *unk48 = &bios->power.unk48;
	int i;

	if (!unk48->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk48->valid) {
		fprintf(out, "Failed to parse THERMAL CHANNEL table at 0x%x, version %x\n", unk48->offset, unk48->version);
		return;
	}

	fprintf(out, "THERMAL CHANNEL table at 0x%x, version %x\n", unk48->offset, unk48->version);
	envy_bios_dump_hex(bios, out, unk48->offset, unk48->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk48->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk48->entries[i].offset, unk48->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}